

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O0

int __thiscall btQuantizedBvh::calcSplittingAxis(btQuantizedBvh *this,int startIndex,int endIndex)

{
  int iVar1;
  int in_EDX;
  int in_ESI;
  btVector3 *in_RDI;
  btVector3 bVar2;
  btVector3 diff2;
  btVector3 center_1;
  btVector3 center;
  int numIndices;
  btVector3 variance;
  btVector3 means;
  int i;
  btScalar in_stack_ffffffffffffff00;
  btScalar in_stack_ffffffffffffff04;
  btScalar in_stack_ffffffffffffff08;
  btScalar in_stack_ffffffffffffff0c;
  btScalar in_stack_ffffffffffffff10;
  btScalar in_stack_ffffffffffffff14;
  float local_98;
  btScalar local_94 [4];
  btScalar local_84 [4];
  btScalar local_74 [4];
  undefined4 local_64;
  btVector3 local_60;
  int local_50;
  btScalar local_4c;
  btScalar local_48;
  btScalar local_44;
  btVector3 local_40;
  btScalar local_30;
  btScalar local_2c;
  btScalar local_28;
  btVector3 local_24;
  int local_14;
  int local_10;
  int local_c;
  
  local_28 = 0.0;
  local_2c = 0.0;
  local_30 = 0.0;
  local_10 = in_EDX;
  local_c = in_ESI;
  btVector3::btVector3(&local_24,&local_28,&local_2c,&local_30);
  local_44 = 0.0;
  local_48 = 0.0;
  local_4c = 0.0;
  btVector3::btVector3(&local_40,&local_44,&local_48,&local_4c);
  local_50 = local_10 - local_c;
  for (local_14 = local_c; local_14 < local_10; local_14 = local_14 + 1) {
    local_64 = 0x3f000000;
    local_84 = (btScalar  [4])
               getAabbMax((btQuantizedBvh *)
                          CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                          (int)((ulong)in_RDI >> 0x20));
    local_94 = (btScalar  [4])
               getAabbMin((btQuantizedBvh *)
                          CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                          (int)((ulong)in_RDI >> 0x20));
    local_74 = (btScalar  [4])
               operator+((btVector3 *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                         (btVector3 *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08))
    ;
    local_60 = ::operator*((btScalar *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00)
                           ,in_RDI);
    btVector3::operator+=(&local_24,&local_60);
  }
  local_98 = 1.0 / (float)local_50;
  btVector3::operator*=(&local_24,&local_98);
  for (local_14 = local_c; local_14 < local_10; local_14 = local_14 + 1) {
    getAabbMax((btQuantizedBvh *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               (int)((ulong)in_RDI >> 0x20));
    getAabbMin((btQuantizedBvh *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               (int)((ulong)in_RDI >> 0x20));
    operator+((btVector3 *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
              (btVector3 *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    ::operator*((btScalar *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),in_RDI);
    bVar2 = operator-((btVector3 *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                      (btVector3 *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    bVar2 = ::operator*((btVector3 *)CONCAT44(bVar2.m_floats[0],in_stack_ffffffffffffff10),
                        (btVector3 *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    in_stack_ffffffffffffff04 = bVar2.m_floats[0];
    in_stack_ffffffffffffff08 = bVar2.m_floats[1];
    in_stack_ffffffffffffff0c = bVar2.m_floats[2];
    in_stack_ffffffffffffff10 = bVar2.m_floats[3];
    in_stack_ffffffffffffff14 = in_stack_ffffffffffffff04;
    btVector3::operator+=(&local_40,(btVector3 *)&stack0xffffffffffffff14);
  }
  btVector3::operator*=(&local_40,(btScalar *)&stack0xffffffffffffff00);
  iVar1 = btVector3::maxAxis(&local_40);
  return iVar1;
}

Assistant:

int	btQuantizedBvh::calcSplittingAxis(int startIndex,int endIndex)
{
	int i;

	btVector3 means(btScalar(0.),btScalar(0.),btScalar(0.));
	btVector3 variance(btScalar(0.),btScalar(0.),btScalar(0.));
	int numIndices = endIndex-startIndex;

	for (i=startIndex;i<endIndex;i++)
	{
		btVector3 center = btScalar(0.5)*(getAabbMax(i)+getAabbMin(i));
		means+=center;
	}
	means *= (btScalar(1.)/(btScalar)numIndices);
		
	for (i=startIndex;i<endIndex;i++)
	{
		btVector3 center = btScalar(0.5)*(getAabbMax(i)+getAabbMin(i));
		btVector3 diff2 = center-means;
		diff2 = diff2 * diff2;
		variance += diff2;
	}
	variance *= (btScalar(1.)/	((btScalar)numIndices-1)	);
	
	return variance.maxAxis();
}